

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Graph *pGVar1;
  long *plVar2;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  *paVar3;
  long lVar4;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  *paVar5;
  ulong uVar6;
  const_iterator cVar7;
  ostream *poVar8;
  AdjList *g;
  long *plVar9;
  size_type __n;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Graph G;
  vector<unsigned_long,_std::allocator<unsigned_long>_> pred;
  WeightMap weight;
  vector<long,_std::allocator<long>_> dist;
  vector<int,_std::allocator<int>_> label;
  variables_map args;
  undefined1 local_388 [24];
  vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
  local_370;
  property_ptr local_358;
  undefined1 local_350 [16];
  undefined1 local_340 [40];
  WeightMap local_318;
  vector<long,_std::allocator<long>_> local_310;
  vector<int,_std::allocator<int>_> local_2f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2e0;
  vector<int,_std::allocator<int>_> local_2c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2b0;
  vector<long,_std::allocator<long>_> local_298;
  int local_27c;
  string local_278;
  string local_258;
  key_type local_238;
  key_type local_218;
  double local_1f8;
  double dStack_1f0;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_1e8;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_1b0;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_178;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_140;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_108;
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  nodes = 100;
  times = 1;
  minWeight = -100;
  maxWeight = 10000;
  parseArguments((int)local_d0,(char **)(ulong)(uint)argc);
  if (edges == 0) {
    lVar4 = nodes * 0x14;
    auVar12._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar12._0_8_ = lVar4;
    auVar12._12_4_ = 0x45300000;
    dStack_1f0 = auVar12._8_8_ - 1.9342813113834067e+25;
    local_1f8 = dStack_1f0 + ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    auVar13._8_4_ = (int)(nodes >> 0x20);
    auVar13._0_8_ = nodes;
    auVar13._12_4_ = 0x45300000;
    dVar11 = log10((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)nodes) - 4503599627370496.0));
    uVar6 = (ulong)(dVar11 * local_1f8);
    edges = (long)(dVar11 * local_1f8 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
  }
  plVar9 = (long *)(local_388 + 0x10);
  local_388._0_8_ = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"test","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_388);
  if ((long *)local_388._0_8_ != plVar9) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if (cVar7._M_node == &local_b8) {
    local_388._0_8_ = plVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"benchmark","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_c0,(key_type *)local_388);
    if (cVar7._M_node == &local_b8) {
      bVar10 = false;
    }
    else {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"random","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find(local_c0,&local_218);
      bVar10 = cVar7._M_node != &local_b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    if ((long *)local_388._0_8_ != plVar9) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
    if (bVar10) {
      createRandomGraph((Graph *)local_388,nodes,edges,minWeight,maxWeight);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[i] Benchmark random graph ",0x1b);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      boost::
      adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
      ::adjacency_list(&local_108,
                       (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                        *)local_388);
      benchmark(&local_108,times);
      if (local_108.m_property.px != (no_property *)0x0) {
        operator_delete(local_108.m_property.px,1);
      }
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::~vector(&local_108.super_type.m_vertices);
      while ((Graph *)local_108.super_type.m_edges.
                      super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next != &local_108) {
        pGVar1 = (Graph *)(((Graph *)
                           local_108.super_type.m_edges.
                           super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                           ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next;
        operator_delete(local_108.super_type.m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next,0x28);
        local_108.super_type.m_edges.
        super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pGVar1;
      }
      if (local_358.px != (no_property *)0x0) {
        operator_delete(local_358.px,1);
      }
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::~vector(&local_370);
      plVar9 = (long *)local_388._0_8_;
      if ((undefined1 *)local_388._0_8_ != local_388) {
        do {
          plVar2 = (long *)*plVar9;
          operator_delete(plVar9,0x28);
          plVar9 = plVar2;
        } while (plVar2 != (long *)local_388);
      }
    }
    else {
      local_388._0_8_ = plVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"benchmark","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::find(local_c0,(key_type *)local_388);
      if (cVar7._M_node == &local_b8) {
        bVar10 = false;
      }
      else {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"grid","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(local_c0,&local_238);
        bVar10 = cVar7._M_node != &local_b8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
      }
      if ((long *)local_388._0_8_ != plVar9) {
        operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
      }
      if (bVar10) {
        createGridGraph((Graph *)local_388,(int)nodes,minWeight,maxWeight);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[i] Benchmark grid graph ",0x19);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        boost::
        adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
        ::adjacency_list(&local_140,
                         (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                          *)local_388);
        benchmark(&local_140,times);
        if (local_140.m_property.px != (no_property *)0x0) {
          operator_delete(local_140.m_property.px,1);
        }
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
        ::~vector(&local_140.super_type.m_vertices);
        while ((Graph *)local_140.super_type.m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next != &local_140) {
          pGVar1 = (Graph *)(((Graph *)
                             local_140.super_type.m_edges.
                             super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                            super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next;
          operator_delete(local_140.super_type.m_edges.
                          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,0x28);
          local_140.super_type.m_edges.
          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pGVar1;
        }
        if (local_358.px != (no_property *)0x0) {
          operator_delete(local_358.px,1);
        }
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
        ::~vector(&local_370);
        plVar9 = (long *)local_388._0_8_;
        if ((undefined1 *)local_388._0_8_ != local_388) {
          do {
            plVar2 = (long *)*plVar9;
            operator_delete(plVar9,0x28);
            plVar9 = plVar2;
          } while (plVar2 != (long *)local_388);
        }
      }
      else {
        local_388._0_8_ = plVar9;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"run","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(local_c0,(key_type *)local_388);
        if ((long *)local_388._0_8_ != plVar9) {
          operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
        }
        if (cVar7._M_node != &local_b8) {
          boost::
          adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
          ::adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                            *)local_388,(no_property *)local_350);
          local_350._0_8_ =
               (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                *)local_340;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"random","");
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::find(local_c0,(key_type *)local_350);
          if ((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
               *)local_350._0_8_ !=
              (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
               *)local_340) {
            operator_delete((void *)local_350._0_8_,(ulong)(local_340._0_8_ + 1));
          }
          if (cVar7._M_node == &local_b8) {
            local_350._0_8_ =
                 (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                  *)local_340;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"grid","");
            cVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    ::find(local_c0,(key_type *)local_350);
            if ((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                 *)local_350._0_8_ !=
                (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                 *)local_340) {
              operator_delete((void *)local_350._0_8_,(ulong)(local_340._0_8_ + 1));
            }
            if (cVar7._M_node == &local_b8) {
              boost::
              adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
              ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                                 *)local_388);
              goto LAB_00105e8e;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[i] Grid graph ",0xf);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::endl<char,std::char_traits<char>>(poVar8);
            createGridGraph((Graph *)local_350,(int)nodes,minWeight,maxWeight);
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::operator=((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                         *)local_388,
                        (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                         *)local_350);
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                               *)local_350);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[i] Random graph ",0x11);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            createRandomGraph((Graph *)local_350,nodes,edges,minWeight,maxWeight);
            boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
            ::operator=((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                         *)local_388,
                        (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                         *)local_350);
            if ((no_property *)local_340._32_8_ != (no_property *)0x0) {
              operator_delete((void *)local_340._32_8_,1);
            }
            std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::~vector((vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       *)(local_340 + 8));
            paVar5 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                      *)local_350._0_8_;
            while (paVar5 != (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                              *)local_350) {
              paVar3 = (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                        *)(paVar5->super_type).m_edges.
                          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next;
              operator_delete(paVar5,0x28);
              paVar5 = paVar3;
            }
          }
          __n = (long)local_370.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_370.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350,__n,
                     (allocator_type *)&local_310);
          local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x7fffffff;
          std::vector<long,_std::allocator<long>_>::vector
                    (&local_310,__n,(value_type_conflict2 *)&local_2f8,(allocator_type *)&local_318)
          ;
          local_318.tag = 0;
          boost::
          adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
          ::adjacency_list(&local_178,
                           (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                            *)local_388);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"graph.dot","");
          printGraphVizToFile(&local_178,&local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if (local_178.m_property.px != (no_property *)0x0) {
            operator_delete(local_178.m_property.px,1);
          }
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::~vector(&local_178.super_type.m_vertices);
          while ((Graph *)local_178.super_type.m_edges.
                          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next != &local_178) {
            pGVar1 = (Graph *)(((Graph *)
                               local_178.super_type.m_edges.
                               super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                               ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                              super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                              ._M_impl._M_node.super__List_node_base._M_next;
            operator_delete(local_178.super_type.m_edges.
                            super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next,0x28);
            local_178.super_type.m_edges.
            super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
            ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pGVar1;
          }
          local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)((ulong)local_2f8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000)
          ;
          bVar10 = bellmanFord((Graph *)local_388,(int *)&local_2f8,&local_318,
                               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350,
                               &local_310);
          if (!bVar10) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"negative cycle detected",0x17);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
            std::ostream::put('(');
            std::ostream::flush();
          }
          local_27c = 0;
          CHECK_BELLMAN_FORD(&local_2f8,(Graph *)local_388,&local_27c,&local_318,
                             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350,
                             &local_310);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[+] Test OK!",0xc);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
          boost::
          adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
          ::adjacency_list(&local_1b0,
                           (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                            *)local_388);
          std::vector<long,_std::allocator<long>_>::vector(&local_298,&local_310);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_2b0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350);
          std::vector<int,_std::allocator<int>_>::vector(&local_2c8,&local_2f8);
          printGraphShortestPath(&local_1b0,&local_298,&local_2b0,&local_2c8);
          if (local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_2b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2b0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2b0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_298.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_1b0.m_property.px != (no_property *)0x0) {
            operator_delete(local_1b0.m_property.px,1);
          }
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::~vector(&local_1b0.super_type.m_vertices);
          while ((Graph *)local_1b0.super_type.m_edges.
                          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next != &local_1b0) {
            pGVar1 = (Graph *)(((Graph *)
                               local_1b0.super_type.m_edges.
                               super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                               ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                              super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                              ._M_impl._M_node.super__List_node_base._M_next;
            operator_delete(local_1b0.super_type.m_edges.
                            super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next,0x28);
            local_1b0.super_type.m_edges.
            super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
            ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pGVar1;
          }
          boost::
          adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
          ::adjacency_list(&local_1e8,
                           (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
                            *)local_388);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_2e0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"shortest-path.dot","");
          printGraphShortestPathVizToFile(&local_1e8,&local_2e0,&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if (local_2e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2e0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2e0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2e0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_1e8.m_property.px != (no_property *)0x0) {
            operator_delete(local_1e8.m_property.px,1);
          }
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::~vector(&local_1e8.super_type.m_vertices);
          while ((Graph *)local_1e8.super_type.m_edges.
                          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next != &local_1e8) {
            pGVar1 = (Graph *)(((Graph *)
                               local_1e8.super_type.m_edges.
                               super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                               ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                              super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                              ._M_impl._M_node.super__List_node_base._M_next;
            operator_delete(local_1e8.super_type.m_edges.
                            super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next,0x28);
            local_1e8.super_type.m_edges.
            super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
            ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pGVar1;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Run the following (if you have graphviz installed) to see the graph images:",
                     0x4b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "  neato -Tpng graph.dot -o graph.png && xdg-open  graph.png",0x3b);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "  neato -Tpng shortest-path.dot -o shortest-path.png && xdg-open shortest-path.png"
                     ,0x52);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
          std::ostream::put('(');
          std::ostream::flush();
          if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((no_property *)
              local_310.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (no_property *)0x0) {
            operator_delete(local_310.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_310.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_310.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
               *)local_350._0_8_ !=
              (adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
               *)0x0) {
            operator_delete((void *)local_350._0_8_,local_340._0_8_ - local_350._0_8_);
          }
          if (local_358.px != (no_property *)0x0) {
            operator_delete(local_358.px,1);
          }
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::~vector(&local_370);
          plVar9 = (long *)local_388._0_8_;
          if ((undefined1 *)local_388._0_8_ != local_388) {
            do {
              plVar2 = (long *)*plVar9;
              operator_delete(plVar9,0x28);
              plVar9 = plVar2;
            } while (plVar2 != (long *)local_388);
          }
        }
      }
    }
  }
  else {
    testAll();
  }
LAB_00105e8e:
  local_d0[0] = std::ofstream::ofstream;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_c0);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    const int INF = (std::numeric_limits < int >::max)();
    nodes = 100;
    times = 1;
    minWeight = -100;
    maxWeight = 10000;

    boost::program_options::variables_map args = parseArguments(argc, argv);
    if (edges==0) {
        edges = static_cast<unsigned long>(20 * nodes * log10(nodes));
    }

    if (args.count("test")) {
        testAll();
    }
    else if (args.count("benchmark") && args.count("random")) {
        Graph G = createRandomGraph(nodes, edges, minWeight, maxWeight);
        std::cout << "[i] Benchmark random graph " << nodes << "x" << edges << std::endl;
        benchmark(G, times);
    }
    else if (args.count("benchmark") && args.count("grid")) {
        Graph G = createGridGraph(static_cast<int>(nodes), minWeight, maxWeight);
        std::cout << "[i] Benchmark grid graph " << nodes << "x" << nodes << std::endl;
        benchmark(G, times);
    }
    else if (args.count("run")) {
        Graph G;
        if (args.count("random")) {
            std::cout << "[i] Random graph " << nodes << "x" << edges << std::endl;
            G = createRandomGraph(nodes, edges, minWeight, maxWeight);
        }
        else if (args.count("grid")) {
            std::cout << "[i] Grid graph " << nodes << "x" << nodes << std::endl;
            G = createGridGraph(static_cast<int>(nodes), minWeight, maxWeight);
        }
        else {
            return 0;
        }

        unsigned long  N = num_vertices(G);
        std::vector<unsigned long> pred(N);
        std::vector<long> dist(N, INF);
        WeightMap weight = get(&EdgeProperties::weight, G);
        printGraphVizToFile(G, "graph.dot");
        bool res = bellmanFord(G, 0, weight, pred, dist);
        if (!res) {
            std::cout << "negative cycle detected" << std::endl;
        }
        std::vector<int> label = CHECK_BELLMAN_FORD(G, 0, weight, pred, dist);
        std::cout << "[+] Test OK!" << std::endl;
        printGraphShortestPath(G, dist, pred, label);
        printGraphShortestPathVizToFile(G, pred, "shortest-path.dot");
        std::cout << "Run the following (if you have graphviz installed) to see the graph images:" << std::endl;
        std::cout << "  neato -Tpng graph.dot -o graph.png && xdg-open  graph.png" << std::endl;
        std::cout << "  neato -Tpng shortest-path.dot -o shortest-path.png && xdg-open shortest-path.png" << std::endl;
    }

    return 0;
}